

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_file_system.cpp
# Opt level: O2

void __thiscall duckdb::MiniZStreamWrapper::Close(MiniZStreamWrapper *this)

{
  _Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false> pStream;
  idx_t iVar1;
  undefined4 uVar2;
  pointer pFVar3;
  uchar gzip_footer [8];
  
  pStream._M_head_impl =
       (this->mz_stream_ptr).
       super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
       .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl;
  if (pStream._M_head_impl != (mz_streamp)0x0) {
    if (this->writing == true) {
      FlushStream(this);
      iVar1 = this->total_size;
      uVar2 = (undefined4)this->crc;
      gzip_footer[4] = (char)iVar1;
      gzip_footer[0] = (char)uVar2;
      gzip_footer[1] = (char)((uint)uVar2 >> 8);
      gzip_footer[2] = (char)((uint)uVar2 >> 0x10);
      gzip_footer[3] = (char)((uint)uVar2 >> 0x18);
      gzip_footer[5] = (char)(iVar1 >> 8);
      gzip_footer[6] = (char)(iVar1 >> 0x10);
      gzip_footer[7] = (uchar)(iVar1 >> 0x18);
      pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator->(&this->file->child_handle);
      (*pFVar3->file_system->_vptr_FileSystem[6])(pFVar3->file_system,pFVar3,gzip_footer,8);
      duckdb_miniz::mz_deflateEnd
                ((this->mz_stream_ptr).
                 super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                 .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl);
    }
    else {
      duckdb_miniz::mz_inflateEnd(pStream._M_head_impl);
    }
    gzip_footer[0] = '\0';
    gzip_footer[1] = '\0';
    gzip_footer[2] = '\0';
    gzip_footer[3] = '\0';
    gzip_footer[4] = '\0';
    gzip_footer[5] = '\0';
    gzip_footer[6] = '\0';
    gzip_footer[7] = '\0';
    std::__uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
    ::reset((__uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
             *)&this->mz_stream_ptr,(pointer)0x0);
    std::unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>::
    ~unique_ptr((unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                 *)gzip_footer);
    this->file = (CompressedFile *)0x0;
  }
  return;
}

Assistant:

void MiniZStreamWrapper::Close() {
	if (!mz_stream_ptr) {
		return;
	}
	if (writing) {
		// flush anything remaining in the stream
		FlushStream();

		// write the footer
		unsigned char gzip_footer[MiniZStream::GZIP_FOOTER_SIZE];
		MiniZStream::InitializeGZIPFooter(gzip_footer, crc, total_size);
		file->child_handle->Write(gzip_footer, MiniZStream::GZIP_FOOTER_SIZE);

		duckdb_miniz::mz_deflateEnd(mz_stream_ptr.get());
	} else {
		duckdb_miniz::mz_inflateEnd(mz_stream_ptr.get());
	}
	mz_stream_ptr = nullptr;
	file = nullptr;
}